

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_playground.cpp
# Opt level: O3

int main(void)

{
  _Manager_type p_Var1;
  ostream *poVar2;
  state_conditions *this;
  long lVar3;
  inputs_type inputs;
  SM sm;
  string local_448;
  inputs_type local_428;
  state_machine<cd_fsm_def> local_408;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- state_machine playground ---\n",0x21);
  estl::state_machine<cd_fsm_def>::state_machine(&local_408);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"states_count() : ",0x11)
  ;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"current state  : ",0x11)
  ;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_408.state_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tv1.size()      : ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  estl::state_machine<cd_fsm_def>::test_transitions(&local_408,&tv1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sm.test_transitions(tv1):",0x19);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_428.time.__d.__r = (duration)0;
  local_428.bay_closed = closed;
  local_428.stop = none;
  local_428.eject = none;
  local_428.power_toggle = none;
  local_408.state_ = closed;
  local_428.play_pause = none;
  local_428.has_disc = active;
  estl::state_machine<cd_fsm_def>::execute_actions(&local_408,closed,&local_428,&local_408.outputs_)
  ;
  cd_fsm_def::outputs_type::debug_str_abi_cxx11_(&local_448,&local_408.outputs_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_448._M_dataplus._M_p,local_448._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::
  vector<estl::state_machine<cd_fsm_def>::action_entry,_std::allocator<estl::state_machine<cd_fsm_def>::action_entry>_>
  ::~vector(&local_408.actions_);
  lVar3 = -0x3c0;
  this = &local_408.state_switches_._M_elems[0xb].switch_conditions_m;
  do {
    std::
    vector<estl::state_machine<cd_fsm_def>::condition,_std::allocator<estl::state_machine<cd_fsm_def>::condition>_>
    ::~vector(&this->conditions_m);
    p_Var1 = (((switch_entry *)(this + -1))->user_do_switch_function_m).super__Function_base.
             _M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&((switch_entry *)(this + -1))->user_do_switch_function_m,
                (_Any_data *)&((switch_entry *)(this + -1))->user_do_switch_function_m,
                __destroy_functor);
    }
    this = this + -2;
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int main()
{
    cout << "--- state_machine playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::closed);
    inputs.has_disc = has_disc_sig::active;
    sm.execute_actions(inputs);


    cout << sm.outputs().debug_str()
         << endl;

    cout << endl;
    return 0;
}